

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O1

bool deqp::gles2::Functional::compareImages
               (RenderContext *renderCtx,TestLog *log,Surface *ref,Surface *res)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  RGBA threshold;
  RGBA local_1c;
  long lVar4;
  
  iVar2 = (*renderCtx->_vptr_RenderContext[4])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  bVar5 = 8 - *(char *)(lVar4 + 8);
  uVar3 = 0;
  if (0 < *(int *)(lVar4 + 0x14)) {
    uVar3 = 0x1000000 << (8U - (char)*(int *)(lVar4 + 0x14) & 0x1f);
  }
  uVar8 = 0x100 << (8U - *(char *)(lVar4 + 0xc) & 0x1f) | 1 << (bVar5 & 0x1f);
  uVar3 = 0x10000 << (8U - *(char *)(lVar4 + 0x10) & 0x1f) | uVar8 | uVar3;
  uVar7 = 1 << (bVar5 & 0x1f) & 0xff;
  if (0xef < uVar7) {
    uVar7 = 0xf0;
  }
  uVar8 = uVar8 >> 8 & 0xff;
  if (0xef < uVar8) {
    uVar8 = 0xf0;
  }
  uVar6 = uVar3 >> 0x10 & 0xff;
  if (0xef < uVar6) {
    uVar6 = 0xf0;
  }
  uVar3 = uVar3 >> 0x18;
  if (0xef < uVar3) {
    uVar3 = 0xf0;
  }
  local_1c.m_value = uVar3 * 0x1000000 + (uVar6 << 0x10 | uVar8 << 8 | uVar7) + 0xf0f0f0f;
  bVar1 = tcu::pixelThresholdCompare
                    (log,"Result","Image compare result",ref,res,&local_1c,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

static bool compareImages (const glu::RenderContext& renderCtx, tcu::TestLog& log, const tcu::Surface& ref, const tcu::Surface& res)
{
	DE_ASSERT(renderCtx.getRenderTarget().getNumSamples() == 0);

	const tcu::RGBA threshold = renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(15,15,15,15);
	return tcu::pixelThresholdCompare(log, "Result", "Image compare result", ref, res, threshold, tcu::COMPARE_LOG_RESULT);
}